

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bond.cpp
# Opt level: O2

String * __thiscall indigox::Bond::ToString_abi_cxx11_(String *__return_storage_ptr__,Bond *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ostream *poVar2;
  Atom_p tmp;
  stringstream ss;
  __shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> local_1d8;
  String local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,"Bond(");
  p_Var1 = (this->atoms_)._M_elems[0].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if ((p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) || (p_Var1->_M_use_count == 0)
     ) {
    std::operator<<(local_198,"\"None\"");
  }
  else {
    std::__shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1d8,&this->atoms_);
    Atom::GetIndex(local_1d8._M_ptr);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    poVar2 = std::operator<<(poVar2,":\"");
    Atom::GetName_abi_cxx11_(&local_1c8,local_1d8._M_ptr);
    poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
    std::operator<<(poVar2,"\"");
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8._M_refcount);
  }
  std::operator<<(local_198,",");
  p_Var1 = (this->atoms_)._M_elems[1].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if ((p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) || (p_Var1->_M_use_count == 0)
     ) {
    std::operator<<(local_198,"\"None\"");
  }
  else {
    std::__shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1d8,(this->atoms_)._M_elems + 1);
    Atom::GetIndex(local_1d8._M_ptr);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    poVar2 = std::operator<<(poVar2,":\"");
    Atom::GetName_abi_cxx11_(&local_1c8,local_1d8._M_ptr);
    poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
    std::operator<<(poVar2,"\"");
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8._M_refcount);
  }
  std::operator<<(local_198,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

String Bond::ToString() const {
    std::stringstream ss;
    ss << "Bond(";
    if (!atoms_[0].expired()) {
      Atom_p tmp = atoms_[0].lock();
      ss << tmp->GetIndex() << ":\"" << tmp->GetName() << "\"";
    } else {
      ss << "\"None\"";
    }
    ss << ",";
    if (!atoms_[1].expired()) {
      Atom_p tmp = atoms_[1].lock();
      ss << tmp->GetIndex() << ":\"" << tmp->GetName() << "\"";
    } else {
      ss << "\"None\"";
    }
    ss << ")";
    return ss.str();
  }